

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# web.cpp
# Opt level: O0

void __thiscall
Web_Context::Note_Changed(Web_Context *this,Am_Object_Advanced *object,Am_Slot_Key key)

{
  Am_Slot this_00;
  bool bVar1;
  Am_Constraint *pAVar2;
  Am_Slot local_30;
  Am_Slot slot;
  Output_Port *curr;
  Am_Slot_Key key_local;
  Am_Object_Advanced *object_local;
  Web_Context *this_local;
  
  slot.data = (Am_Slot_Data *)Output_Port::Search(this->owner->out_list,object,key);
  if (slot.data == (Am_Slot_Data *)0x0) {
    local_30 = Am_Object_Advanced::Get_Slot(object,key);
    pAVar2 = Am_Web_Data::operator_cast_to_Am_Constraint_(this->owner);
    Am_Slot::Change(&local_30,pAVar2);
    pAVar2 = Am_Web_Data::operator_cast_to_Am_Constraint_(this->owner);
    Am_Slot::Add_Constraint(&local_30,pAVar2);
  }
  else {
    bVar1 = Am_Slot::operator==((Am_Slot *)slot.data,&this->validating_slot);
    this_00.data = slot.data;
    if (bVar1) {
      this->been_set = true;
      this->changed = true;
    }
    else {
      pAVar2 = Am_Web_Data::operator_cast_to_Am_Constraint_(this->owner);
      Am_Slot::Change((Am_Slot *)this_00.data,pAVar2);
    }
  }
  return;
}

Assistant:

void
Web_Context::Note_Changed(const Am_Object_Advanced &object, Am_Slot_Key key)
{
  Output_Port *curr = owner->out_list->Search(object, key);
  if (curr) {
    if (curr->context == validating_slot) {
      been_set = true;
      changed = true;
    } else
      curr->context.Change(*owner);
    return;
  }
  Am_Slot slot = object.Get_Slot(key);
  slot.Change(*owner);
  slot.Add_Constraint(*owner);
}